

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

xmlXPathFunction libxml_xmlXPathFuncLookupFunc(void *ctxt,xmlChar *name,xmlChar *ns_uri)

{
  int iVar1;
  int local_2c;
  int i;
  xmlChar *ns_uri_local;
  xmlChar *name_local;
  void *ctxt_local;
  
  local_2c = 0;
  while( true ) {
    if (libxml_xpathCallbacksNb <= local_2c) {
      return (xmlXPathFunction)0x0;
    }
    if (((ctxt == *(void **)(libxml_xpathCallbacks + (long)local_2c * 0x20)) &&
        (iVar1 = xmlStrEqual(name,*(undefined8 *)(libxml_xpathCallbacks + (long)local_2c * 0x20 + 8)
                            ), iVar1 != 0)) &&
       (iVar1 = xmlStrEqual(ns_uri,*(undefined8 *)
                                    (libxml_xpathCallbacks + (long)local_2c * 0x20 + 0x10)),
       iVar1 != 0)) break;
    local_2c = local_2c + 1;
  }
  return libxml_xmlXPathFuncCallback;
}

Assistant:

static xmlXPathFunction
libxml_xmlXPathFuncLookupFunc(void *ctxt, const xmlChar * name,
                              const xmlChar * ns_uri)
{
    int i;

    /*
     * This is called once only. The address is then stored in the
     * XPath expression evaluation, the proper object to call can
     * then still be found using the execution context function
     * and functionURI fields.
     */
    for (i = 0; i < libxml_xpathCallbacksNb; i++) {
			if ((ctxt == (*libxml_xpathCallbacks)[i].ctx) &&
					(xmlStrEqual(name, (*libxml_xpathCallbacks)[i].name)) &&
					(xmlStrEqual(ns_uri, (*libxml_xpathCallbacks)[i].ns_uri))) {
            return (libxml_xmlXPathFuncCallback);
        }
    }
    return (NULL);
}